

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O2

void __thiscall read_config(void *this,char *config_path)

{
  int iVar1;
  ALLEGRO_CONFIG *cfg;
  int *piVar2;
  ulong uVar3;
  char tmp [64];
  
  cfg = (ALLEGRO_CONFIG *)al_load_config_file(config_path);
  if (cfg == (ALLEGRO_CONFIG *)0x0) {
    cfg = (ALLEGRO_CONFIG *)al_create_config();
  }
  piVar2 = &DAT_001117e8;
  for (uVar3 = 0; uVar3 != 3; uVar3 = uVar3 + 1) {
    snprintf(tmp,0x40,"button%d",uVar3 & 0xffffffff);
    iVar1 = get_config_int(cfg,"KEYBOARD",tmp,*piVar2);
    *(int *)(*(long *)((long)this + 0x20) + uVar3 * 4) = iVar1;
    piVar2 = piVar2 + 1;
  }
  al_destroy_config(cfg);
  return;
}

Assistant:

static void read_config(VCONTROLLER * this, const char *config_path)
{
   int i;
   char tmp[64];
   int def[] = {
      ALLEGRO_KEY_LEFT,
      ALLEGRO_KEY_RIGHT,
      ALLEGRO_KEY_SPACE
   };

   ALLEGRO_CONFIG *c = al_load_config_file(config_path);
   if (!c) c = al_create_config();

   for (i = 0; i < 3; i++) {
      snprintf(tmp, sizeof(tmp), "button%d", i);
      ((int *)(this->private_data))[i] =
         get_config_int(c, "KEYBOARD", tmp, def[i]);
   }

   al_destroy_config(c);
}